

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O3

void __thiscall Code_generator::visit(Code_generator *this,Inst_shift *s)

{
  uint uVar1;
  uint uVar2;
  Register *pRVar3;
  Expression *pEVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  string local_88;
  string local_68;
  string local_48;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  pRVar3 = s->rn;
  if (7 < pRVar3->n) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Invalid register","");
    error_report(&pRVar3->location,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  iVar7 = (*s->constant->_vptr_Expression[3])();
  if ((char)iVar7 != '\0') {
    pEVar4 = s->constant;
    if (pEVar4->type == LABEL) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Can\'t be a label, must be a constant","");
      error_report(&pEVar4->location,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    else if (pEVar4->type == ABSOLUTE) {
      uVar2 = pEVar4->value;
      if ((uVar2 & 0xfff0) != 0) {
        string_printf_abi_cxx11_
                  (&local_48,
                   "Expression\'s value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)",
                   (ulong)(uVar2 & 0xffff),(ulong)(uVar2 & 0xffff),4,(ulong)(uVar2 & 0xf),
                   uVar2 & 0xf);
        warning_report(&pEVar4->location,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      uVar1 = s->operation - 0x142;
      uVar6 = 0xf800;
      if (s->operation != 0x145) {
        uVar6 = 0;
      }
      uVar5 = (short)uVar1 * 0x800 + 0xe000;
      if (2 < uVar1) {
        uVar5 = uVar6;
      }
      ast::Sections::write16
                ((s->super_Instruction).super_Statement.section_index,
                 (s->super_Instruction).super_Statement.section_offset,
                 (short)(s->rn->n << 4) + ((ushort)((uVar2 & 0xf) << 7) | uVar5) + (short)s->rd->n);
    }
  }
  return;
}

Assistant:

void Code_generator::visit(Inst_shift *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");

	if (s->constant->evaluate()) {
		auto position_type = s->constant->get_type();
		if (position_type == ABSOLUTE) {
			auto constant = s->constant->get_value();
			if (constant < 0) {
				error_report(&s->constant->location,"Expression's value must be a positive number");
			}
			else if ((constant & ~MAKE_MASK(SHIFT_CONST_SIZE, 0)) != 0) {
				warning_report(&s->constant->location,
					string_printf("Expression's value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)",
							constant, constant, SHIFT_CONST_SIZE,
							constant & MAKE_MASK(SHIFT_CONST_SIZE, 0),
							constant & MAKE_MASK(SHIFT_CONST_SIZE, 0)));
			}
			Sections::write16(s->section_index, s->section_offset,
				static_cast<uint16_t>(((
					s->operation == LSL ? LSL_OPCODE
				  		: s->operation == LSR ? LSR_OPCODE
							: s->operation == ASR ? ASR_OPCODE
								: s->operation == ROR ? ROR_OPCODE : 0))
					+ ((constant & MAKE_MASK(SHIFT_CONST_SIZE, 0)) << SHIFT_CONST_POSITION)
					+ (s->rn->n << RN_POSITION) + (s->rd->n << RD_POSITION)));
		}
		else if (position_type == Value_type::LABEL)
			error_report(&s->constant->location,"Can't be a label, must be a constant");
	}
}